

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void BoostLexicalCastOnStack<unsigned_short>(void)

{
  long lVar1;
  ostream *poVar2;
  undefined8 extraout_RDX;
  undefined1 auVar3 [16];
  undefined1 local_80 [8];
  buf_t buf;
  ResultType _result;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  poVar2 = std::operator<<(poVar2,_endl<char,std::char_traits<char>> +
                                  (*_endl<char,std::char_traits<char>> == '*'));
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"boost::lexical_cast on stack");
  std::operator<<(poVar2,"... ");
  std::ostream::flush();
  _result.__r = (rep)(buf._M_elems + 0x38);
  auVar3 = std::chrono::_V2::steady_clock::now();
  for (_prof.mStart.__d.__r._6_2_ = 0; _prof.mResult = auVar3._0_8_,
      _prof.mStart.__d.__r._6_2_ != -1; _prof.mStart.__d.__r._6_2_ = _prof.mStart.__d.__r._6_2_ + 1)
  {
    boost::lexical_cast<std::array<char,64ul>,unsigned_short>
              ((array<char,_64UL> *)local_80,(boost *)((long)&_prof.mStart.__d.__r + 6),auVar3._8_8_
              );
    auVar3._8_8_ = extraout_RDX;
    auVar3._0_8_ = _prof.mResult;
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&_result);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar2 = std::ostream::_M_insert<double>((double)buf._M_elems._56_8_);
  poVar2 = std::operator<<(poVar2,"s");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void BoostLexicalCastOnStack()
{
    typedef std::array<char, 64> buf_t;
    PROFILING_BEGIN(T, "boost::lexical_cast on stack")
    buf_t buf = boost::lexical_cast<buf_t>(i);
    PROFILING_END()
}